

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2padded_cell.cc
# Opt level: O3

void __thiscall S2PaddedCell::S2PaddedCell(S2PaddedCell *this,S2CellId id,double padding)

{
  ulong uVar1;
  int iVar2;
  double dVar3;
  int ij [2];
  undefined8 local_98;
  S2CellId local_90;
  double local_88;
  VType local_78;
  ostream *poStack_70;
  VType local_68;
  VType VStack_60;
  R2Point local_58;
  R2Rect local_48;
  
  (this->id_).id_ = id.id_;
  this->padding_ = padding;
  (this->bound_).bounds_[0].bounds_.c_[0] = 1.0;
  (this->bound_).bounds_[0].bounds_.c_[1] = 0.0;
  (this->bound_).bounds_[1].bounds_.c_[0] = 1.0;
  (this->bound_).bounds_[1].bounds_.c_[1] = 0.0;
  (this->middle_).bounds_[0].bounds_.c_[0] = 1.0;
  (this->middle_).bounds_[0].bounds_.c_[1] = 0.0;
  (this->middle_).bounds_[1].bounds_.c_[0] = 1.0;
  (this->middle_).bounds_[1].bounds_.c_[1] = 0.0;
  if ((id.id_ & 0xfffffffffffffff) == 0) {
    dVar3 = padding + 1.0;
    (this->bound_).bounds_[0].bounds_.c_[0] = -dVar3;
    (this->bound_).bounds_[0].bounds_.c_[1] = dVar3;
    (this->bound_).bounds_[1].bounds_.c_[0] = -dVar3;
    (this->bound_).bounds_[1].bounds_.c_[1] = dVar3;
    (this->middle_).bounds_[0].bounds_.c_[0] = -padding;
    (this->middle_).bounds_[0].bounds_.c_[1] = padding;
    (this->middle_).bounds_[1].bounds_.c_[0] = -padding;
    (this->middle_).bounds_[1].bounds_.c_[1] = padding;
    this->ij_lo_[0] = 0;
    this->ij_lo_[1] = 0;
    this->orientation_ = (uint)(id.id_ >> 0x3d) & 1;
    this->level_ = 0;
  }
  else {
    local_90.id_ = id.id_;
    local_88 = padding;
    S2CellId::ToFaceIJOrientation
              (&local_90,(int *)&local_98,(int *)((long)&local_98 + 4),&this->orientation_);
    if (local_90.id_ == 0) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
                 ,0x223,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poStack_70,"Check failed: id_ != 0 ",0x17);
      abort();
    }
    uVar1 = 0;
    if (local_90.id_ != 0) {
      for (; (local_90.id_ >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
      }
    }
    iVar2 = 0x1e - ((uint)(uVar1 >> 1) & 0x7fffffff);
    this->level_ = iVar2;
    S2CellId::IJLevelToBoundUV(&local_48,(int *)&local_98,iVar2);
    local_58.c_[0] = local_88;
    local_58.c_[1] = local_88;
    R2Rect::Expanded(&local_48,&local_58);
    (this->bound_).bounds_[1].bounds_.c_[0] = local_68;
    (this->bound_).bounds_[1].bounds_.c_[1] = VStack_60;
    (this->bound_).bounds_[0].bounds_.c_[0] = local_78;
    (this->bound_).bounds_[0].bounds_.c_[1] = (VType)poStack_70;
    iVar2 = -1 << (0x1eU - (char)this->level_ & 0x1f);
    *(ulong *)this->ij_lo_ = CONCAT44(iVar2,iVar2) & local_98;
  }
  return;
}

Assistant:

S2PaddedCell::S2PaddedCell(S2CellId id, double padding)
    : id_(id), padding_(padding) {
  if (id_.is_face()) {
    // Fast path for constructing a top-level face (the most common case).
    double limit = 1 + padding;
    bound_ = R2Rect(R1Interval(-limit, limit), R1Interval(-limit, limit));
    middle_ = R2Rect(R1Interval(-padding, padding),
                     R1Interval(-padding, padding));
    ij_lo_[0] = ij_lo_[1] = 0;
    orientation_ = id_.face() & 1;
    level_ = 0;
  } else {
    int ij[2];
    id.ToFaceIJOrientation(&ij[0], &ij[1], &orientation_);
    level_ = id.level();
    bound_ = S2CellId::IJLevelToBoundUV(ij, level_).Expanded(padding);
    int ij_size = S2CellId::GetSizeIJ(level_);
    ij_lo_[0] = ij[0] & -ij_size;
    ij_lo_[1] = ij[1] & -ij_size;
  }
}